

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void DL::Expressions::print_val(Data *d,stringstream *stream)

{
  ostream *poVar1;
  bool bVar2;
  DataGroup *pDVar3;
  size_t sVar4;
  vector_t<Data> *pvVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong i;
  pointer d_00;
  Float FVar8;
  Data x;
  Data local_90;
  
  switch(d->mType) {
  case DT_Group:
    pDVar3 = Data::getGroup(d);
    bVar2 = DataGroup::isArray(pDVar3);
    poVar1 = (ostream *)(stream + 0x10);
    if (bVar2) {
      std::operator<<(poVar1,"[");
    }
    else {
      poVar6 = std::operator<<(poVar1,"(");
      pDVar3 = Data::getGroup(d);
      DataGroup::id_abi_cxx11_(&local_90.mKey,pDVar3);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      std::operator<<(poVar6," ");
      std::__cxx11::string::~string((string *)&local_90);
    }
    i = 0;
    while( true ) {
      pDVar3 = Data::getGroup(d);
      sVar4 = DataGroup::anonymousCount(pDVar3);
      if (sVar4 <= i) break;
      pDVar3 = Data::getGroup(d);
      DataGroup::at(&local_90,pDVar3,i);
      print_val(&local_90,stream);
      pDVar3 = Data::getGroup(d);
      sVar4 = DataGroup::anonymousCount(pDVar3);
      if (i != sVar4 - 1) {
        std::operator<<(poVar1,", ");
      }
      Data::~Data(&local_90);
      i = i + 1;
    }
    pDVar3 = Data::getGroup(d);
    sVar4 = DataGroup::anonymousCount(pDVar3);
    if (sVar4 != 0) {
      pDVar3 = Data::getGroup(d);
      pvVar5 = DataGroup::getNamedEntries(pDVar3);
      if ((pvVar5->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar5->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::operator<<(poVar1,", ");
      }
    }
    pDVar3 = Data::getGroup(d);
    pvVar5 = DataGroup::getNamedEntries(pDVar3);
    d_00 = (pvVar5->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_start;
    while( true ) {
      pDVar3 = Data::getGroup(d);
      pvVar5 = DataGroup::getNamedEntries(pDVar3);
      if (d_00 == (pvVar5->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                  super__Vector_impl_data._M_finish) break;
      poVar6 = std::operator<<(poVar1,":");
      std::__cxx11::string::string((string *)&local_90,(string *)d_00);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      std::operator<<(poVar6," ");
      std::__cxx11::string::~string((string *)&local_90);
      print_val(d_00,stream);
      d_00 = d_00 + 1;
      pDVar3 = Data::getGroup(d);
      pvVar5 = DataGroup::getNamedEntries(pDVar3);
      if (d_00 != (pvVar5->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
        std::operator<<(poVar1,", ");
      }
    }
    pDVar3 = Data::getGroup(d);
    bVar2 = DataGroup::isArray(pDVar3);
    if (bVar2) {
      pcVar7 = "]";
    }
    else {
      pcVar7 = ")";
    }
    std::operator<<(poVar1,pcVar7);
    break;
  case DT_Integer:
    Data::getInt(d);
    std::ostream::_M_insert<long>((long)(stream + 0x10));
    return;
  case DT_Float:
    FVar8 = Data::getFloat(d);
    std::ostream::operator<<((ostream *)(stream + 0x10),FVar8);
    return;
  case DT_Bool:
    bVar2 = Data::getBool(d);
    pcVar7 = "false";
    if (bVar2) {
      pcVar7 = "true";
    }
    goto LAB_0011018a;
  case DT_String:
    Data::getString_abi_cxx11_(&local_90.mKey,d);
    std::operator<<((ostream *)(stream + 0x10),(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  default:
    pcVar7 = "###UNKNOWN### ";
LAB_0011018a:
    std::operator<<((ostream *)(stream + 0x10),pcVar7);
    return;
  }
  return;
}

Assistant:

static void print_val(const Data& d, std::stringstream& stream)
{
	switch (d.type()) {
	case DT_Bool:
		stream << (d.getBool() ? "true" : "false");
		break;
	case DT_Integer:
		stream << d.getInt();
		break;
	case DT_Float:
		stream << d.getFloat();
		break;
	case DT_String:
		stream << d.getString();
		break;
	case DT_Group:
		if (d.getGroup().isArray())
			stream << "[";
		else
			stream << "(" << d.getGroup().id() << " ";

		for (size_t i = 0; i < d.getGroup().anonymousCount(); ++i) {
			Data x = d.getGroup().at(i);
			print_val(x, stream);

			if (i != d.getGroup().anonymousCount() - 1)
				stream << ", ";
		}

		if (d.getGroup().anonymousCount() > 0 && d.getGroup().getNamedEntries().size() > 0)
			stream << ", ";

		for (auto it = d.getGroup().getNamedEntries().begin();
			 it != d.getGroup().getNamedEntries().end();) {
			stream << ":" << it->key() << " ";
			print_val(*it, stream);

			it++;
			if (it != d.getGroup().getNamedEntries().end())
				stream << ", ";
		}

		if (d.getGroup().isArray())
			stream << "]";
		else
			stream << ")";

		break;
	default:
		stream << "###UNKNOWN### ";
		break;
	}
}